

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizable_split.cpp
# Opt level: O0

bool __thiscall
ftxui::anon_unknown_5::ResizableSplitTopBase::OnMouseEvent(ResizableSplitTopBase *this,Event *event)

{
  int x;
  bool bVar1;
  Mouse *pMVar2;
  Event local_68;
  unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
  local_28;
  Event *local_20;
  Event *event_local;
  ResizableSplitTopBase *this_local;
  
  local_20 = event;
  event_local = (Event *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->captured_mouse_);
  if ((bVar1) && (pMVar2 = Event::mouse(event), pMVar2->motion == Released)) {
    std::
    unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>::
    reset(&this->captured_mouse_,(pointer)0x0);
    this_local._7_1_ = 1;
  }
  else {
    pMVar2 = Event::mouse(event);
    if ((pMVar2->button == Left) && (pMVar2 = Event::mouse(event), pMVar2->motion == Pressed)) {
      pMVar2 = Event::mouse(event);
      x = pMVar2->x;
      pMVar2 = Event::mouse(event);
      bVar1 = Box::Contain(&this->separator_box_,x,pMVar2->y);
      if ((bVar1) &&
         (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->captured_mouse_),
         !bVar1)) {
        ComponentBase::CaptureMouse((ComponentBase *)&local_28,(Event *)this);
        std::
        unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
        ::operator=(&this->captured_mouse_,&local_28);
        std::
        unique_ptr<ftxui::CapturedMouseInterface,_std::default_delete<ftxui::CapturedMouseInterface>_>
        ::~unique_ptr(&local_28);
        this_local._7_1_ = 1;
        goto LAB_0018d864;
      }
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->captured_mouse_);
    if (bVar1) {
      pMVar2 = Event::mouse(event);
      *this->main_size_ = pMVar2->y - (this->global_box_).y_min;
      this_local._7_1_ = 1;
    }
    else {
      Event::Event(&local_68,event);
      this_local._7_1_ = ComponentBase::OnEvent(&this->super_ComponentBase,&local_68);
      Event::~Event(&local_68);
    }
  }
LAB_0018d864:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool OnMouseEvent(Event event) {
    if (captured_mouse_ && event.mouse().motion == Mouse::Released) {
      captured_mouse_.reset();
      return true;
    }

    if (event.mouse().button == Mouse::Left &&
        event.mouse().motion == Mouse::Pressed &&
        separator_box_.Contain(event.mouse().x, event.mouse().y) &&
        !captured_mouse_) {
      captured_mouse_ = CaptureMouse(event);
      return true;
    }

    if (captured_mouse_) {
      *main_size_ = event.mouse().y - global_box_.y_min;
      return true;
    }

    return ComponentBase::OnEvent(event);
  }